

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::icosphereMesh(Mesh *__return_storage_ptr__,float _radius,size_t _iterations)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar5;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar6;
  pointer pvVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  Mesh *this;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  float fVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pvVar19;
  size_t i;
  int iVar20;
  int iVar21;
  size_t i_1;
  bool bVar22;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar23 [16];
  float fVar24;
  vec<3,_float,_(glm::qualifier)0> vVar25;
  initializer_list<unsigned_int> __l;
  vec3 v;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vector<int,_std::allocator<int>_> indexToSplit;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1a8 [8];
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  uint32_t i1;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_194;
  float local_18c;
  float local_188;
  float local_184;
  uint32_t i3;
  uint32_t i2;
  undefined8 local_178;
  undefined8 uStack_170;
  Mesh *local_160;
  size_t local_158;
  size_t local_150;
  ulong local_148;
  long local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texCoords;
  
  vertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT416(0);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f59c440bf069650;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)texCoords.
                        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  local_18c = _radius;
  local_158 = _iterations;
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f59c4403f069650;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)texCoords.
                        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f06965000000000;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xbf59c440);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f06965000000000;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f59c440);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf59c440;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xbf069650);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf59c440;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f069650);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f59c440;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xbf069650);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f59c440;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f069650);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf06965000000000;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0xbf59c440);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf06965000000000;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f59c440);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf59c440bf069650;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)texCoords.
                        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf59c4403f069650;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)texCoords.
                        super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  std::
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>::
  emplace_back<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
              *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&texCoords);
  local_160 = __return_storage_ptr__;
  memcpy(&texCoords,&DAT_002d4c80,0xf0);
  __l._M_len = 0x3c;
  __l._M_array = (iterator)&texCoords;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,__l,
             (allocator_type *)&indexToSplit);
  sVar13 = 0;
  uVar11 = (long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
           (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 2;
  while (sVar13 != local_158) {
    local_148 = uVar11 << 2;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar11 = local_148 / 0xc;
    lVar14 = 8;
    local_150 = sVar13;
    while (puVar10 = local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage,
          puVar9 = local_1c8._M_impl.super__Vector_impl_data._M_finish,
          puVar8 = local_1c8._M_impl.super__Vector_impl_data._M_start, bVar22 = uVar11 != 0,
          uVar11 = uVar11 - 1, bVar22) {
      aVar4 = *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
               ((long)&((pointer)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + -8))->
                       field_0 + lVar14);
      i1 = (uint32_t)aVar4;
      i2 = *(uint *)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + lVar14 + -4);
      i3 = *(uint *)((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                           local_1c8._M_impl.super__Vector_impl_data._M_start + lVar14);
      lVar12 = (long)vertices.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertices.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_188 = vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_2.z;
      local_178._0_4_ =
           *(float *)&vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i2].field_0;
      local_178._4_4_ =
           *(float *)&vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i2].field_1;
      local_184 = vertices.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i2].field_2.z;
      local_138._0_4_ =
           *(float *)&vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_0;
      local_138._4_4_ =
           *(float *)&vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_1;
      uVar2 = vertices.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i3].field_0;
      uVar3 = vertices.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i3].field_1;
      local_1a8._4_4_ = uVar3;
      local_1a8._0_4_ = uVar2;
      _uStack_1a0 = 0;
      fVar15 = vertices.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i3].field_2.z;
      uStack_130 = 0;
      uStack_170 = 0;
      v.field_0.x = (float)local_138 + (float)local_178;
      v.field_1.y = local_138._4_4_ + local_178._4_4_;
      v.field_2.z = local_188 + local_184;
      local_140 = lVar14;
      vVar25 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&v);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = vVar25.field_0;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = vVar25.field_1;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = vVar25.field_2;
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&indexToSplit);
      v.field_0.x = (float)local_178 + (float)local_1a8._0_4_;
      v.field_1.y = local_178._4_4_ + (float)local_1a8._4_4_;
      v.field_2.z = local_184 + fVar15;
      vVar25 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&v);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = vVar25.field_0;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = vVar25.field_1;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = vVar25.field_2;
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&indexToSplit);
      v.field_2.z = local_188 + fVar15;
      v.field_1.y = local_138._4_4_ + (float)local_1a8._4_4_;
      v.field_0.x = (float)local_138 + (float)local_1a8._0_4_;
      vVar25 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&v);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = vVar25.field_0;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = vVar25.field_1;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = vVar25.field_2;
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::emplace_back<glm::vec<3,float,(glm::qualifier)0>>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&vertices,(vec<3,_float,_(glm::qualifier)0> *)&indexToSplit);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,&i1);
      iVar21 = (int)(lVar12 / 0xc);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar21;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      fVar15 = (float)(iVar21 + 2);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar15;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,&i2);
      iVar20 = iVar21 + 1;
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar21;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,&i3);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar15;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar21;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar15;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords,
                 (uint *)&indexToSplit);
      lVar14 = local_140 + 0xc;
    }
    local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)texCoords.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8._M_impl.super__Vector_impl_data._M_start =
         (pointer)texCoords.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_1c8._M_impl.super__Vector_impl_data._M_finish =
         (pointer)texCoords.
                  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar9;
    texCoords.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar10;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&texCoords);
    uVar11 = local_148;
    sVar13 = local_150 + 1;
  }
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texCoords.
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar14 = 8;
  uVar11 = 0;
  while( true ) {
    pvVar7 = vertices.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)vertices.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar11) break;
    fVar15 = *(float *)((long)vertices.
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
    fVar1 = *(float *)((long)&(vertices.
                               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar14);
    local_1a8._0_4_ = atan2f(fVar1,fVar15);
    local_1a8._4_4_ = extraout_XMM0_Db;
    uStack_1a0 = extraout_XMM0_Dc;
    uStack_19c = extraout_XMM0_Dd;
    fVar15 = atan2f(*(float *)((long)pvVar7 + lVar14 + -4),SQRT(fVar15 * fVar15 + fVar1 * fVar1));
    auVar23._0_8_ = (double)(float)local_1a8._0_4_;
    auVar23._8_8_ = (double)fVar15;
    auVar23 = divpd(auVar23,_DAT_002d4ba0);
    indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1.0 - (float)(auVar23._0_8_ + 0.5);
    indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ = 1.0 - (float)(auVar23._8_8_ + 0.5);
    std::
    vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
    ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
              ((vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                *)&texCoords,(vec<2,_float,_(glm::qualifier)0> *)&indexToSplit);
    uVar11 = uVar11 + 1;
    lVar14 = lVar14 + 0xc;
  }
  indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  lVar14 = 0;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 2) / 3;
      uVar11 = uVar11 + 1) {
    aVar5 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
             ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                    local_1c8._M_impl.super__Vector_impl_data._M_start + lVar14);
    fVar15 = texCoords.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(uint)aVar5].field_0.x;
    fVar1 = texCoords.
            super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start
            [*(uint *)((long)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + 4) + lVar14
                      )].field_0.x;
    aVar6 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
             ((long)&((pointer)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + 8))->
                     field_0 + lVar14);
    fVar24 = texCoords.
             super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(uint)aVar6].field_0.x;
    _local_1a8 = ZEXT416((uint)fVar24);
    if (0.5 < ABS(fVar24 - fVar15)) {
      local_178 = CONCAT44(local_178._4_4_,fVar15);
      if (0.5 <= fVar15) {
        v.field_0 = aVar6;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
      else {
        v.field_0 = aVar5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
      fVar24 = (float)local_1a8._0_4_;
      fVar15 = (float)local_178;
    }
    if (0.5 < ABS(fVar1 - fVar15)) {
      if (0.5 <= fVar15) {
        v.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                     ((long)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + 4) + lVar14)
        ;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
      else {
        v.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                     ((long)(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
                            local_1c8._M_impl.super__Vector_impl_data._M_start + lVar14);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
      fVar24 = (float)local_1a8._0_4_;
    }
    if (0.5 < ABS(fVar24 - fVar1)) {
      if (0.5 <= fVar1) {
        v.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                     ((long)&((pointer)
                             ((long)local_1c8._M_impl.super__Vector_impl_data._M_start + 8))->
                             field_0 + lVar14);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
      else {
        v.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                     ((long)((long)local_1c8._M_impl.super__Vector_impl_data._M_start + 4) + lVar14)
        ;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&indexToSplit,(int *)&v);
      }
    }
    lVar14 = lVar14 + 0xc;
  }
  for (uVar11 = 0; this = local_160,
      uVar11 < (ulong)(CONCAT44(indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_) -
                       CONCAT44(indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_) >> 2); uVar11 = uVar11 + 1)
  {
    aVar4 = *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
             (CONCAT44(indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) + uVar11 * 4);
    v.field_0 = vertices.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_0;
    v.field_1 = vertices.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_1;
    v.field_2 = vertices.
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_2;
    i1 = (uint32_t)
         (texCoords.
          super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_0.x + 1.0);
    aStack_194.y = texCoords.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(uint)aVar4].field_1.y + 0.0;
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::push_back(&vertices,&v);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::push_back(&texCoords,(value_type *)&i1);
    lVar14 = (long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 2;
    uVar16 = 2;
    uVar17 = 1;
    uVar18 = 0;
    pvVar19 = (pointer)local_1c8._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      bVar22 = lVar14 == 0;
      lVar14 = lVar14 + -1;
      if (bVar22) break;
      if ((pvVar19->field_0 == aVar4) &&
         ((lVar12 = (uVar18 / 3) * 0xc,
          0.5 < texCoords.
                super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(uint *)((long)local_1c8._M_impl.super__Vector_impl_data._M_start +
                          uVar18 * 4 + lVar12 + (uVar17 / 3) * -0xc + 4)].field_0.x ||
          (0.5 < texCoords.
                 super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(uint *)((long)local_1c8._M_impl.super__Vector_impl_data._M_start +
                           uVar18 * 4 + lVar12 + (uVar16 / 3) * -0xc + 8)].field_0.x)))) {
        pvVar19->field_0 =
             (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)
             ((int)(((long)vertices.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertices.
                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc) + -1);
      }
      pvVar19 = (pointer)&pvVar19->field_1;
      uVar17 = uVar17 + 1;
      uVar16 = uVar16 + 1;
      uVar18 = uVar18 + 1;
    }
  }
  Mesh::Mesh(local_160);
  Mesh::addNormals(this,&vertices);
  Mesh::addTexCoords(this,&texCoords);
  lVar14 = 0;
  uVar11 = 0;
  while( true ) {
    if ((ulong)(((long)vertices.
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)vertices.
                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar11) break;
    glm::vec<3,float,(glm::qualifier)0>::operator*=
              ((vec<3,float,(glm::qualifier)0> *)
               ((long)&(vertices.
                        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar14),local_18c);
    uVar11 = uVar11 + 1;
    lVar14 = lVar14 + 0xc;
  }
  Mesh::addVertices(this,&vertices);
  Mesh::addIndices(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8);
  Mesh::computeTangents(this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indexToSplit.super__Vector_base<int,_std::allocator<int>_>);
  std::
  _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&texCoords.
                   super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c8);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&vertices.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  return this;
}

Assistant:

Mesh icosphereMesh(float _radius, size_t _iterations) {

    /// Step 1 : Generate icosahedron
    const float sqrt5 = sqrt(5.0f);
    const float phi = (1.0f + sqrt5) * 0.5f;
    const float invnorm = 1/sqrt(phi*phi+1);

    std::vector<glm::vec3> vertices;
    vertices.push_back(invnorm * glm::vec3(-1,  phi, 0));//0
    vertices.push_back(invnorm * glm::vec3( 1,  phi, 0));//1
    vertices.push_back(invnorm * glm::vec3(0,   1,  -phi));//2
    vertices.push_back(invnorm * glm::vec3(0,   1,   phi));//3
    vertices.push_back(invnorm * glm::vec3(-phi,0,  -1));//4
    vertices.push_back(invnorm * glm::vec3(-phi,0,   1));//5
    vertices.push_back(invnorm * glm::vec3( phi,0,  -1));//6
    vertices.push_back(invnorm * glm::vec3( phi,0,   1));//7
    vertices.push_back(invnorm * glm::vec3(0,   -1, -phi));//8
    vertices.push_back(invnorm * glm::vec3(0,   -1,  phi));//9
    vertices.push_back(invnorm * glm::vec3(-1,  -phi,0));//10
    vertices.push_back(invnorm * glm::vec3( 1,  -phi,0));//11
       
    std::vector<INDEX_TYPE> indices = {
        0,1,2,
        0,3,1,
        0,4,5,
        1,7,6,
        1,6,2,
        1,3,7,
        0,2,4,
        0,5,3,
        2,6,8,
        2,8,4,
        3,5,9,
        3,9,7,
        11,6,7,
        10,5,4,
        10,4,8,
        10,9,5,
        11,8,6,
        11,7,9,
        10,8,11,
        10,11,9
    };

    size_t size = indices.size();

    /// Step 2 : tessellate
    for (size_t iteration = 0; iteration < _iterations; iteration++) {
        size*=4;
        std::vector<INDEX_TYPE> newFaces;
        for (size_t i = 0; i < size/12; i++) {
            INDEX_TYPE i1 = indices[i*3];
            INDEX_TYPE i2 = indices[i*3+1];
            INDEX_TYPE i3 = indices[i*3+2];
            size_t i12 = vertices.size();
            size_t i23 = i12+1;
            size_t i13 = i12+2;
            glm::vec3 v1 = vertices[i1];
            glm::vec3 v2 = vertices[i2];
            glm::vec3 v3 = vertices[i3];
            //make 1 vertice at the center of each edge and project it onto the sphere
            vertices.push_back(glm::normalize(v1+v2));
            vertices.push_back(glm::normalize(v2+v3));
            vertices.push_back(glm::normalize(v1+v3));
            //now recreate indices
            newFaces.push_back(i1);
            newFaces.push_back(i12);
            newFaces.push_back(i13);
            newFaces.push_back(i2);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i3);
            newFaces.push_back(i13);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i23);
            newFaces.push_back(i13);
        }
        indices.swap(newFaces);
    }

    /// Step 3 : generate texcoords
    std::vector<glm::vec2> texCoords;
    for (size_t i = 0; i < vertices.size(); i++) {
        const auto& vec = vertices[i];
        float u, v;
        float r0 = sqrtf(vec.x*vec.x+vec.z*vec.z);
        float alpha;
        alpha = atan2f(vec.z,vec.x);
        u = alpha/TAU+.5f;
        v = atan2f(vec.y, r0)/PI + .5f;
        // reverse the u coord, so the default is texture mapped left to
        // right on the outside of a sphere 
        // reverse the v coord, so that texture origin is at top left
        texCoords.push_back(glm::vec2(1.0-u,1.f-v));
    }

    /// Step 4 : fix texcoords
    // find vertices to split
    std::vector<int> indexToSplit;

    for (size_t i=0; i<indices.size()/3; i++) {
        glm::vec2 t0 = texCoords[indices[i*3+0]];
        glm::vec2 t1 = texCoords[indices[i*3+1]];
        glm::vec2 t2 = texCoords[indices[i*3+2]];

        if (std::abs(t2.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
        if (std::abs(t1.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+1]);
        }
        if (std::abs(t2.x-t1.x)>0.5) {
            if (t1.x<0.5)
                indexToSplit.push_back(indices[i*3+1]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
    }

    //split vertices
    for (size_t i = 0; i < indexToSplit.size(); i++) {
        INDEX_TYPE index = indexToSplit[i];
        //duplicate vertex
        glm::vec3 v = vertices[index];
        glm::vec2 t = texCoords[index] + glm::vec2(1.f, 0.f);
        vertices.push_back(v);
        texCoords.push_back(t);
        size_t newIndex = vertices.size()-1;
        //reassign indices
        for (size_t j = 0; j<indices.size(); j++) {
            if (indices[j] == index) {
                INDEX_TYPE index1 = indices[(j+1)%3+(j/3)*3];
                INDEX_TYPE index2 = indices[(j+2)%3+(j/3)*3];
                if ((texCoords[index1].x>0.5) || (texCoords[index2].x>0.5))
                    indices[j] = newIndex;
            }
        }
    }

    Mesh mesh;
    mesh.addNormals( vertices );
    mesh.addTexCoords( texCoords );

    for (size_t i = 0; i < vertices.size(); i++ )
        vertices[i] *= _radius;

    mesh.addVertices( vertices );
    mesh.addIndices( indices );
    mesh.computeTangents();

    return  mesh;
}